

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccallback.c
# Opt level: O2

void lj_ccallback_leave(CTState *cts,TValue *o)

{
  lua_State *plVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  long lVar4;
  uint uVar5;
  CCallback *dp;
  CType *d;
  
  plVar1 = cts->L;
  pTVar2 = plVar1->base;
  pTVar3 = plVar1->top;
  plVar1->base = pTVar3;
  if ((pTVar3 <= o) && (*(char *)((pTVar3[-2].u64 & 0x7fffffffffff) + 10) == '\0')) {
    lVar4 = *(long *)((pTVar3[-2].u64 & 0x7fffffffffff) + 0x20);
    *(ulong *)((long)plVar1->cframe + 0x18) = lVar4 + (ulong)*(uint *)(lVar4 + -0x5c) * 4 + 4;
  }
  uVar5 = cts->tab[*(ushort *)(pTVar3 + -3)].info;
  if ((uVar5 & 0xf0000000) != 0x40000000) {
    d = cts->tab + *(ushort *)(pTVar3 + -3);
    dp = (CCallback *)(cts->cb).gpr;
    if ((uVar5 & 0xf4000000) == 0x4000000) {
      dp = &cts->cb;
    }
    lj_cconv_ct_tv(cts,d,(uint8_t *)dp,o,0);
    if (((d->info & 0xf4000000) == 0) && (uVar5 = d->size, uVar5 < 4)) {
      if ((d->info >> 0x17 & 1) == 0) {
        if (uVar5 == 1) {
          uVar5 = (uint)*(char *)dp->fpr;
        }
        else {
          uVar5 = (uint)*(short *)dp->fpr;
        }
      }
      else if (uVar5 == 1) {
        uVar5 = (uint)*(byte *)dp->fpr;
      }
      else {
        uVar5 = (uint)*(ushort *)dp->fpr;
      }
      *(uint *)dp->fpr = uVar5;
    }
  }
  plVar1->top = plVar1->top + -4;
  plVar1->base = pTVar2;
  plVar1->cframe = *(void **)((long)plVar1->cframe + 0x20);
  (cts->cb).slot = 0;
  return;
}

Assistant:

void LJ_FASTCALL lj_ccallback_leave(CTState *cts, TValue *o)
{
  lua_State *L = cts->L;
  GCfunc *fn;
  TValue *obase = L->base;
  L->base = L->top;  /* Keep continuation frame for throwing errors. */
  if (o >= L->base) {
    /* PC of RET* is lost. Point to last line for result conv. errors. */
    fn = curr_func(L);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      setcframe_pc(L->cframe, proto_bc(pt)+pt->sizebc+1);
    }
  }
  callback_conv_result(cts, L, o);
  /* Finally drop C frame and continuation frame. */
  L->top -= 2+2*LJ_FR2;
  L->base = obase;
  L->cframe = cframe_prev(L->cframe);
  cts->cb.slot = 0;  /* Blacklist C function that called the callback. */
}